

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertMaterial
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *mat_abs_path,
          Material *material,RenderMaterial *rmat_out)

{
  Stage *this_00;
  undefined8 *puVar1;
  RenderMaterial *pRVar2;
  bool bVar3;
  int iVar4;
  Shader *pSVar5;
  UsdPreviewSurface *shader;
  ostream *poVar6;
  Material *args;
  string *err_00;
  long lVar7;
  PreviewSurfaceShader pss;
  Prim *shaderPrim;
  string err;
  Path surfacePath;
  ostringstream ss_e;
  RenderMaterial rmat;
  string local_4a0;
  Path *local_480;
  string local_478;
  RenderMaterial *local_458;
  RenderSceneConverterEnv *local_450;
  PreviewSurfaceShader local_448;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_3b0;
  string local_398;
  Path local_378;
  undefined1 local_2a8 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [12];
  undefined1 local_130 [32];
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  bool local_d0 [4];
  float local_cc [12];
  ShaderParam<float> local_9c;
  ShaderParam<float> SStack_94;
  ShaderParam<float> local_8c;
  ShaderParam<float> SStack_84;
  ShaderParam<float> local_7c;
  ShaderParam<float> SStack_74;
  ShaderParam<float> local_6c;
  float afStack_64 [4];
  ShaderParam<float> SStack_54;
  ShaderParam<float> local_4c;
  uint64_t local_40;
  uint64_t uStack_38;
  
  if (rmat_out == (RenderMaterial *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"ConvertMaterial",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x1389);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"rmat_out argument is nullptr.",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_130._0_8_);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
    ::std::ios_base::~ios_base((ios_base *)(local_2a8 + 0x70));
    return false;
  }
  local_130._0_8_ = local_130 + 0x10;
  local_130._8_8_ = 0;
  local_130[0x10] = '\0';
  local_110._M_p = (pointer)&local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0[0] = false;
  local_cc[0] = 0.18;
  local_cc[1] = 0.18;
  local_cc[2] = 0.18;
  local_cc[3] = -NAN;
  local_cc[4] = 0.0;
  local_cc[5] = 0.0;
  local_cc[6] = 0.0;
  local_cc[7] = -NAN;
  local_cc[8] = 0.0;
  local_cc[9] = 0.0;
  local_cc[10] = 0.0;
  local_cc[0xb] = -NAN;
  local_9c.value = 0.0;
  local_9c.texture_id = -1;
  SStack_94.value = 0.5;
  SStack_94.texture_id = -1;
  local_8c.value = 0.0;
  local_8c.texture_id = -1;
  SStack_84.value = 0.01;
  SStack_84.texture_id = -1;
  local_7c.value = 1.0;
  local_7c.texture_id = -1;
  SStack_74.value = 0.0;
  SStack_74.texture_id = -1;
  local_6c.value = 1.5;
  local_6c.texture_id = -1;
  afStack_64[0] = 0.0;
  afStack_64[1] = 0.0;
  afStack_64[2] = 1.0;
  afStack_64[3] = -NAN;
  SStack_54.value = 0.0;
  SStack_54.texture_id = -1;
  local_4c.value = 0.0;
  local_4c.texture_id = -1;
  local_40 = 0;
  uStack_38 = 0;
  args = material;
  local_458 = rmat_out;
  ::std::__cxx11::string::_M_assign((string *)&local_110);
  Path::element_name_abi_cxx11_(mat_abs_path);
  ::std::__cxx11::string::_M_assign((string *)local_130);
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_398._M_string_length = 0;
  local_398.field_2._M_local_buf[0] = '\0';
  local_378._prim_part._M_dataplus._M_p = (pointer)&local_378._prim_part.field_2;
  local_378._prim_part._M_string_length = 0;
  local_378._prim_part.field_2._M_local_buf[0] = '\0';
  local_378._prop_part._M_dataplus._M_p = (pointer)&local_378._prop_part.field_2;
  local_378._prop_part._M_string_length = 0;
  local_378._prop_part.field_2._M_local_buf[0] = '\0';
  local_378._variant_part._M_dataplus._M_p = (pointer)&local_378._variant_part.field_2;
  local_378._variant_part._M_string_length = 0;
  local_378._variant_part.field_2._M_local_buf[0] = '\0';
  local_378._variant_selection_part._M_dataplus._M_p =
       (pointer)&local_378._variant_selection_part.field_2;
  local_378._variant_selection_part._M_string_length = 0;
  local_378._variant_selection_part.field_2._M_local_buf[0] = '\0';
  local_378._variant_part_str._M_dataplus._M_p = (pointer)&local_378._variant_part_str.field_2;
  local_378._variant_part_str._M_string_length = 0;
  local_378._variant_part_str.field_2._M_local_buf[0] = '\0';
  local_378._element._M_dataplus._M_p = (pointer)&local_378._element.field_2;
  local_378._element._M_string_length = 0;
  local_378._element.field_2._M_local_buf[0] = '\0';
  local_378._path_type.has_value_ = false;
  local_378._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  local_378._valid = false;
  if ((material->surface)._authored != true) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[warn]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"ConvertMaterial",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x13a7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4a0,
               "{}\'s outputs:surface isn\'t authored, so not a valid Material/Shader. Create a default Material\n"
               ,"");
    Path::full_path_name_abi_cxx11_(&local_478,mat_abs_path);
    fmt::format<std::__cxx11::string>
              ((string *)&local_448,(fmt *)&local_4a0,(string *)&local_478,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_2a8,
                        (char *)CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_),
                        CONCAT44(local_448.diffuseColor.value._M_elems[2],
                                 local_448.diffuseColor.value._M_elems[1]));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    puVar1 = (undefined8 *)&local_448.diffuseColor.texture_id;
    if ((undefined8 *)CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_) != puVar1)
    {
      operator_delete((undefined8 *)
                      CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_),
                      CONCAT44(local_448.emissiveColor.value._M_elems[0],
                               local_448.diffuseColor.texture_id) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    pRVar2 = local_458;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append
              ((char *)&this->_warn,
               CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_));
    if ((undefined8 *)CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_) != puVar1)
    {
      operator_delete((undefined8 *)
                      CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_),
                      CONCAT44(local_448.emissiveColor.value._M_elems[0],
                               local_448.diffuseColor.texture_id) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
    ::std::ios_base::~ios_base((ios_base *)(local_2a8 + 0x70));
    ::std::__cxx11::string::_M_assign((string *)pRVar2);
    ::std::__cxx11::string::_M_assign((string *)&pRVar2->abs_path);
    ::std::__cxx11::string::_M_assign((string *)&pRVar2->display_name);
    memcpy(&pRVar2->surfaceShader,local_d0,0xa0);
LAB_00359fe2:
    bVar3 = true;
    goto LAB_0035a790;
  }
  local_480 = mat_abs_path;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&local_3b0,
             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&material->surface);
  lVar7 = (long)local_3b0.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_3b0.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar7 == 0xd0) {
    Path::operator=(&local_378,
                    local_3b0.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_450 = env;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"ConvertMaterial",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x139f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4a0,
               "{}\'s outputs:surface must be connection with single target Path.\n","");
    Path::full_path_name_abi_cxx11_(&local_478,local_480);
    fmt::format<std::__cxx11::string>
              ((string *)&local_448,(fmt *)&local_4a0,(string *)&local_478,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_2a8,
                        (char *)CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_),
                        CONCAT44(local_448.diffuseColor.value._M_elems[2],
                                 local_448.diffuseColor.value._M_elems[1]));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    puVar1 = (undefined8 *)&local_448.diffuseColor.texture_id;
    if ((undefined8 *)CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_) != puVar1)
    {
      operator_delete((undefined8 *)
                      CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_),
                      CONCAT44(local_448.emissiveColor.value._M_elems[0],
                               local_448.diffuseColor.texture_id) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append
              ((char *)&this->_err,
               CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_));
    if ((undefined8 *)CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_) != puVar1)
    {
      operator_delete((undefined8 *)
                      CONCAT44(local_448.diffuseColor.value._M_elems[0],local_448._0_4_),
                      CONCAT44(local_448.emissiveColor.value._M_elems[0],
                               local_448.diffuseColor.texture_id) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
    ::std::ios_base::~ios_base((ios_base *)(local_2a8 + 0x70));
    env = local_450;
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_3b0);
  if (lVar7 == 0xd0) {
    local_3b0.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (Path *)0x0;
    this_00 = env->stage;
    local_448._0_8_ = &local_448.diffuseColor.texture_id;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"");
    Path::Path((Path *)local_2a8,(string *)&local_378,(string *)&local_448);
    err_00 = &local_398;
    bVar3 = Stage::find_prim_at_path(this_00,(Path *)local_2a8,(Prim **)&local_3b0,err_00);
    if (local_208._M_p != local_2a8 + 0xb0) {
      operator_delete(local_208._M_p,local_1f8[0]._M_allocated_capacity + 1);
    }
    if (local_228._M_p != local_2a8 + 0x90) {
      operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
    }
    puVar1 = (undefined8 *)&local_448.diffuseColor.texture_id;
    if ((undefined1 *)local_2a8._96_8_ != local_2a8 + 0x70) {
      operator_delete((void *)local_2a8._96_8_,local_238._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a8._64_8_ != local_2a8 + 0x50) {
      operator_delete((void *)local_2a8._64_8_,local_2a8._80_8_ + 1);
    }
    if ((undefined1 *)local_2a8._32_8_ != local_2a8 + 0x30) {
      operator_delete((void *)local_2a8._32_8_,local_2a8._48_8_ + 1);
    }
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((undefined8 *)local_448._0_8_ != puVar1) {
      operator_delete((void *)local_448._0_8_,
                      CONCAT44(local_448.emissiveColor.value._M_elems[0],
                               local_448.diffuseColor.texture_id) + 1);
    }
    if (bVar3) {
      if (local_3b0.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start == (Path *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"ConvertMaterial",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x13bd);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"[InternalError] invalid Shader Prim.\n",0x25);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"\n",1);
        goto LAB_0035a72c;
      }
      pSVar5 = tinyusdz::value::Value::as<tinyusdz::Shader>
                         ((Value *)&local_3b0.
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_start[3]._prop_part.
                                    _M_string_length,false);
      if (pSVar5 == (Shader *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"ConvertMaterial",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x13c6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a0,
                   "{}\'s outputs:surface must be connected to Shader Prim, but connected to `{}` Prim.\n"
                   ,"");
        fmt::format<std::__cxx11::string>
                  ((string *)&local_448,(fmt *)&local_4a0,
                   &local_3b0.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                    _M_impl.super__Vector_impl_data._M_start[3]._prim_part,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err_00);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_2a8,(char *)local_448._0_8_,
                            CONCAT44(local_448.diffuseColor.value._M_elems[2],
                                     local_448.diffuseColor.value._M_elems[1]));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((undefined8 *)local_448._0_8_ != puVar1) {
          operator_delete((void *)local_448._0_8_,
                          CONCAT44(local_448.emissiveColor.value._M_elems[0],
                                   local_448.diffuseColor.texture_id) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,local_448._0_8_);
        if ((undefined8 *)local_448._0_8_ == puVar1) goto LAB_0035a76d;
        goto LAB_0035a760;
      }
      shader = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(&pSVar5->value,false);
      if (shader == (UsdPreviewSurface *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"ConvertMaterial",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x13ce);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a0,"Shader\'s info:id must be UsdPreviewSurface, but got {}",""
                  );
        fmt::format<std::__cxx11::string>
                  ((string *)&local_448,(fmt *)&local_4a0,(string *)&pSVar5->info_id,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err_00);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_2a8,(char *)local_448._0_8_,
                            CONCAT44(local_448.diffuseColor.value._M_elems[2],
                                     local_448.diffuseColor.value._M_elems[1]));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((int32_t *)local_448._0_8_ != &local_448.diffuseColor.texture_id) {
          operator_delete((void *)local_448._0_8_,
                          CONCAT44(local_448.emissiveColor.value._M_elems[0],
                                   local_448.diffuseColor.texture_id) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) goto LAB_0035a65d;
        goto LAB_0035a72c;
      }
      iVar4 = ::std::__cxx11::string::compare((char *)&local_378._prop_part);
      if (iVar4 == 0) {
        local_448._0_4_ = local_448._0_4_ & 0xffffff00;
        local_448.diffuseColor.value._M_elems[0] = 0.18;
        local_448.diffuseColor.value._M_elems[1] = 0.18;
        local_448.diffuseColor.value._M_elems[2] = 0.18;
        local_448.diffuseColor.texture_id = 0xffffffff;
        local_448.emissiveColor.value._M_elems[0] = 0.0;
        local_448.emissiveColor.value._M_elems[1] = 0.0;
        local_448.emissiveColor.value._M_elems[2] = 0.0;
        local_448.emissiveColor.texture_id = -1;
        local_448.specularColor.value._M_elems[0] = 0.0;
        local_448.specularColor.value._M_elems[1] = 0.0;
        local_448.specularColor.value._M_elems[2] = 0.0;
        local_448.specularColor.texture_id = -1;
        local_448.metallic.value = 0.0;
        local_448.metallic.texture_id = -1;
        local_448.roughness.value = 0.5;
        local_448.roughness.texture_id = -1;
        local_448.clearcoat.value = 0.0;
        local_448.clearcoat.texture_id = -1;
        local_448.clearcoatRoughness.value = 0.01;
        local_448.clearcoatRoughness.texture_id = -1;
        local_448.opacity.value = 1.0;
        local_448.opacity.texture_id = -1;
        local_448.opacityThreshold.value = 0.0;
        local_448.opacityThreshold.texture_id = -1;
        local_448.ior.value = 1.5;
        local_448.ior.texture_id = -1;
        local_448.normal.value._M_elems[0] = 0.0;
        local_448.normal.value._M_elems[1] = 0.0;
        local_448.normal.value._M_elems[2] = 1.0;
        local_448.normal.texture_id = -1;
        local_448.displacement.value = 0.0;
        local_448.displacement.texture_id = -1;
        local_448.occlusion.value = 0.0;
        local_448.occlusion.texture_id = -1;
        local_448.handle = 0;
        bVar3 = ConvertPreviewSurfaceShader(this,env,&local_378,shader,&local_448);
        if (bVar3) {
          memcpy(local_d0,&local_448,0x98);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a8,"ConvertMaterial",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x13dc);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_478,"Failed to convert UsdPreviewSurface : {}","");
          fmt::format<std::__cxx11::string>
                    (&local_4a0,(fmt *)&local_478,&local_378._prim_part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)shader);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2a8,local_4a0._M_dataplus._M_p,
                              local_4a0._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_4a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
          ::std::ios_base::~ios_base((ios_base *)(local_2a8 + 0x70));
        }
        if (bVar3) {
          RenderMaterial::operator=(local_458,(RenderMaterial *)local_130);
          goto LAB_00359fe2;
        }
        goto LAB_0035a78e;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,"ConvertMaterial",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x13d6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4a0,
                 "{}\'s outputs:surface connection must point to property `outputs:surface`, but got `{}`"
                 ,"");
      Path::full_path_name_abi_cxx11_(&local_478,local_480);
      fmt::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)&local_448,(fmt *)&local_4a0,&local_478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_378._prop_part,&rmat_out->name);
      puVar1 = (undefined8 *)&local_448.diffuseColor.texture_id;
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_2a8,(char *)local_448._0_8_,
                          CONCAT44(local_448.diffuseColor.value._M_elems[2],
                                   local_448.diffuseColor.value._M_elems[1]));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((undefined8 *)local_448._0_8_ != puVar1) {
        operator_delete((void *)local_448._0_8_,
                        CONCAT44(local_448.emissiveColor.value._M_elems[0],
                                 local_448.diffuseColor.texture_id) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,local_448._0_8_);
      if ((undefined8 *)local_448._0_8_ != puVar1) goto LAB_0035a760;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,"ConvertMaterial",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0x13b8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4a0,
                 "{}\'s outputs:surface isn\'t connected to exising Prim path.\n","");
      Path::full_path_name_abi_cxx11_(&local_478,local_480);
      fmt::format<std::__cxx11::string>
                ((string *)&local_448,(fmt *)&local_4a0,(string *)&local_478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err_00);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_2a8,(char *)local_448._0_8_,
                          CONCAT44(local_448.diffuseColor.value._M_elems[2],
                                   local_448.diffuseColor.value._M_elems[1]));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((undefined8 *)local_448._0_8_ != puVar1) {
        operator_delete((void *)local_448._0_8_,
                        CONCAT44(local_448.emissiveColor.value._M_elems[0],
                                 local_448.diffuseColor.texture_id) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
LAB_0035a65d:
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
LAB_0035a72c:
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,local_448._0_8_);
      if ((int32_t *)local_448._0_8_ != &local_448.diffuseColor.texture_id) {
LAB_0035a760:
        operator_delete((void *)local_448._0_8_,
                        CONCAT44(local_448.emissiveColor.value._M_elems[0],
                                 local_448.diffuseColor.texture_id) + 1);
      }
    }
LAB_0035a76d:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
    ::std::ios_base::~ios_base((ios_base *)(local_2a8 + 0x70));
  }
LAB_0035a78e:
  bVar3 = false;
LAB_0035a790:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._element._M_dataplus._M_p != &local_378._element.field_2) {
    operator_delete(local_378._element._M_dataplus._M_p,
                    CONCAT71(local_378._element.field_2._M_allocated_capacity._1_7_,
                             local_378._element.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._variant_part_str._M_dataplus._M_p != &local_378._variant_part_str.field_2) {
    operator_delete(local_378._variant_part_str._M_dataplus._M_p,
                    CONCAT71(local_378._variant_part_str.field_2._M_allocated_capacity._1_7_,
                             local_378._variant_part_str.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._variant_selection_part._M_dataplus._M_p !=
      &local_378._variant_selection_part.field_2) {
    operator_delete(local_378._variant_selection_part._M_dataplus._M_p,
                    CONCAT71(local_378._variant_selection_part.field_2._M_allocated_capacity._1_7_,
                             local_378._variant_selection_part.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._variant_part._M_dataplus._M_p != &local_378._variant_part.field_2) {
    operator_delete(local_378._variant_part._M_dataplus._M_p,
                    CONCAT71(local_378._variant_part.field_2._M_allocated_capacity._1_7_,
                             local_378._variant_part.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._prop_part._M_dataplus._M_p != &local_378._prop_part.field_2) {
    operator_delete(local_378._prop_part._M_dataplus._M_p,
                    CONCAT71(local_378._prop_part.field_2._M_allocated_capacity._1_7_,
                             local_378._prop_part.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._prim_part._M_dataplus._M_p != &local_378._prim_part.field_2) {
    operator_delete(local_378._prim_part._M_dataplus._M_p,
                    CONCAT71(local_378._prim_part.field_2._M_allocated_capacity._1_7_,
                             local_378._prim_part.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,
                    CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                             local_398.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,
                    CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p != &local_100) {
    operator_delete(local_110._M_p,
                    CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
  }
  return bVar3;
}

Assistant:

bool RenderSceneConverter::ConvertMaterial(const RenderSceneConverterEnv &env,
                                           const Path &mat_abs_path,
                                           const tinyusdz::Material &material,
                                           RenderMaterial *rmat_out) {
  if (!rmat_out) {
    PUSH_ERROR_AND_RETURN("rmat_out argument is nullptr.");
  }

  RenderMaterial rmat;
  rmat.abs_path = mat_abs_path.prim_part();
  rmat.name = mat_abs_path.element_name();
  DCOUT("rmat.abs_path = " << rmat.abs_path);
  DCOUT("rmat.name = " << rmat.name);
  std::string err;
  Path surfacePath;

  //
  // surface shader
  {
    if (material.surface.authored()) {
      auto paths = material.surface.get_connections();
      DCOUT("paths = " << paths);
      // must have single targetPath.
      if (paths.size() != 1) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("{}'s outputs:surface must be connection with single "
                        "target Path.\n",
                        mat_abs_path.full_path_name()));
      }
      surfacePath = paths[0];
    } else {
      // May be PhysicsMaterial?
      // Create dummy material

      PUSH_WARN(fmt::format("{}'s outputs:surface isn't authored, so not a valid Material/Shader. Create a default Material\n",
                      mat_abs_path.full_path_name()));


      (*rmat_out) = rmat;
      return true;

      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface isn't authored.\n",
                      mat_abs_path.full_path_name()));
    }

    const Prim *shaderPrim{nullptr};
    if (!env.stage.find_prim_at_path(
            Path(surfacePath.prim_part(), /* prop part */ ""), shaderPrim,
            &err)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "{}'s outputs:surface isn't connected to exising Prim path.\n",
          mat_abs_path.full_path_name()));
    }

    if (!shaderPrim) {
      // this should not happen though.
      PUSH_ERROR_AND_RETURN("[InternalError] invalid Shader Prim.\n");
    }

    const Shader *shader = shaderPrim->as<Shader>();

    if (!shader) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface must be connected to Shader Prim, "
                      "but connected to `{}` Prim.\n",
                      shaderPrim->prim_type_name()));
    }

    // Currently must be UsdPreviewSurface
    const UsdPreviewSurface *psurface = shader->value.as<UsdPreviewSurface>();
    if (!psurface) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Shader's info:id must be UsdPreviewSurface, but got {}",
                      shader->info_id));
    }

    // prop part must be `outputs:surface` for now.
    if (surfacePath.prop_part() != "outputs:surface") {
      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface connection must point to property "
                      "`outputs:surface`, but got `{}`",
                      mat_abs_path.full_path_name(), surfacePath.prop_part()));
    }

    PreviewSurfaceShader pss;
    if (!ConvertPreviewSurfaceShader(env, surfacePath, *psurface, &pss)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to convert UsdPreviewSurface : {}", surfacePath.prim_part()));
    }

    rmat.surfaceShader = pss;
  }

  DCOUT("Converted Material: " << mat_abs_path);

  (*rmat_out) = rmat;
  return true;
}